

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_graph_utilities.cpp
# Opt level: O3

void __thiscall
test_graph_utilities_pseudo_peripheral_vertex_Test::
~test_graph_utilities_pseudo_peripheral_vertex_Test
          (test_graph_utilities_pseudo_peripheral_vertex_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_graph_utilities, pseudo_peripheral_vertex) {

  Adjacency_Graph graph_saad = create_graph_saad();

  // Check to get the end vertices.
  EXPECT_EQ(pseudo_peripheral_vertex(graph_saad, 11), 5);
  EXPECT_EQ(pseudo_peripheral_vertex(graph_saad, 2), 0);

  // Insert a new edge, then search from the otheside of the graph, this should be the new peripheral vertex.
  graph_saad.insert({0, 15});
  EXPECT_EQ(pseudo_peripheral_vertex(graph_saad, 5), 15);

  // Death test.
  EXPECT_DEATH(pseudo_peripheral_vertex(Adjacency_Graph<false>()), "./*");
  EXPECT_DEATH(pseudo_peripheral_vertex(graph_saad, 16), "./*");
}